

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_insert2
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  uint uVar5;
  REF_STATUS RVar6;
  REF_INT *pRVar7;
  long lVar8;
  int iVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  REF_INT item;
  long lVar13;
  bool bVar14;
  REF_INT seg_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_NODE local_40;
  ulong local_38;
  
  local_40 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = local_40->ref_mpi->id;
  if ((iVar1 == local_40->part[node]) && (iVar1 == local_40->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cell = ref_grid->cell[3];
      uVar11 = 0xffffffff;
      item = -1;
      if (-1 < site) {
        pRVar2 = ref_cell->ref_adj;
        uVar11 = 0xffffffff;
        item = -1;
        if (site < pRVar2->nnode) {
          uVar5 = pRVar2->first[site];
          uVar11 = 0xffffffff;
          item = -1;
          if ((long)(int)uVar5 != -1) {
            item = pRVar2->item[(int)uVar5].ref;
            uVar11 = (ulong)uVar5;
          }
        }
      }
      do {
        if ((int)uVar11 == -1) {
          if ((ref_cavity->debug != 0) &&
             (ref_cavity_tec(ref_cavity,"form-tri.tec"), ref_cavity->debug != 0)) {
            printf("insert form tri state %d\n",(ulong)ref_cavity->state);
          }
          RVar6 = ref_cavity_verify_seg_manifold(ref_cavity);
          if (RVar6 == 0) {
            if (ref_cavity->debug != 0) {
              printf("insert tri manifold state %d\n",(ulong)ref_cavity->state);
            }
            uVar5 = ref_cavity_enlarge_conforming(ref_cavity);
            if (uVar5 == 0) {
              if (ref_cavity->state != REF_CAVITY_VISIBLE) {
                return 1;
              }
              ref_cavity->state = REF_CAVITY_UNKNOWN;
              if (ref_cavity->debug != 0) {
                printf("insert tri conforming state %d\n",0);
              }
              uVar5 = ref_cavity_form_insert2_tet(ref_cavity,faceid);
              if (uVar5 == 0) {
                return 0;
              }
              pcVar12 = "form tet ball";
              uVar10 = 0x48c;
            }
            else {
              pcVar12 = "enlarge boundary";
              uVar10 = 0x484;
            }
          }
          else {
            pcVar12 = "ball seg manifold";
            uVar5 = 1;
            uVar10 = 0x480;
          }
LAB_00191d17:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar10,"ref_cavity_form_insert2",(ulong)uVar5,pcVar12);
          return uVar5;
        }
        iVar1 = ref_cell->node_per;
        lVar8 = 0;
        iVar9 = 0;
        if (0 < iVar1) {
          iVar9 = iVar1;
        }
        bVar14 = false;
        for (; lVar13 = (long)item, iVar9 != (int)lVar8; lVar8 = lVar8 + 1) {
          bVar4 = !bVar14;
          bVar14 = true;
          if (bVar4) {
            bVar14 = ref_cell->c2n[ref_cell->size_per * lVar13 + lVar8] == protect;
          }
        }
        local_38 = uVar11;
        if ((!bVar14) &&
           ((faceid == -1 || (ref_cell->c2n[ref_cell->size_per * item + iVar1] == faceid)))) {
          uVar5 = ref_list_contains(ref_cavity->tri_list,item,&already_have_it);
          if (uVar5 != 0) {
            pcVar12 = "have tri?";
            uVar10 = 0x45e;
            goto LAB_00191d17;
          }
          if (already_have_it != 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x45f,"ref_cavity_form_insert2","added tri twice?");
            return 1;
          }
          uVar5 = ref_list_push(ref_cavity->tri_list,item);
          if (uVar5 != 0) {
            pcVar12 = "save tri";
            uVar10 = 0x460;
            goto LAB_00191d17;
          }
          uVar5 = ref_cell_all_local(ref_cell,local_40,item,&all_local);
          if (uVar5 != 0) {
            pcVar12 = "local cell";
            uVar10 = 0x461;
            goto LAB_00191d17;
          }
          if (all_local == 0) {
            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
            return 0;
          }
          pRVar7 = ref_cell->c2n;
          lVar8 = ref_cell->size_per * lVar13;
          seg_nodes[2] = pRVar7[(long)(int)lVar8 + (long)ref_cell->node_per];
          seg_nodes[0] = pRVar7[lVar8 + 1];
          seg_nodes[1] = pRVar7[lVar8 + 2];
          if (seg_nodes[1] != node && seg_nodes[0] != node) {
            uVar5 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
            if (uVar5 != 0) {
              pcVar12 = "tri side";
              uVar10 = 0x46c;
              goto LAB_00191d17;
            }
            pRVar7 = ref_cell->c2n;
            lVar8 = ref_cell->size_per * lVar13;
          }
          seg_nodes[0] = pRVar7[lVar8 + 2];
          seg_nodes[1] = pRVar7[lVar8];
          if (seg_nodes[1] != node && seg_nodes[0] != node) {
            uVar5 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
            if (uVar5 != 0) {
              pcVar12 = "tri side";
              uVar10 = 0x472;
              goto LAB_00191d17;
            }
            pRVar7 = ref_cell->c2n;
            lVar8 = ref_cell->size_per * lVar13;
          }
          seg_nodes[0] = pRVar7[lVar8];
          seg_nodes[1] = pRVar7[lVar8 + 1];
          if ((seg_nodes[1] != node && seg_nodes[0] != node) &&
             (uVar5 = ref_cavity_insert_seg(ref_cavity,seg_nodes), uVar5 != 0)) {
            pcVar12 = "tri side";
            uVar10 = 0x478;
            goto LAB_00191d17;
          }
        }
        pRVar3 = ref_cell->ref_adj->item;
        uVar11 = (ulong)pRVar3[(int)local_38].next;
        item = -1;
        if (uVar11 != 0xffffffffffffffff) {
          item = pRVar3[uVar11].ref;
        }
      } while( true );
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2(REF_CAVITY ref_cavity,
                                           REF_GRID ref_grid, REF_INT node,
                                           REF_INT site, REF_INT protect,
                                           REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_BOOL already_have_it, all_local, has_node;
  REF_INT seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tri?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tri.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert form tri state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert tri manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  if (ref_cavity_debug(ref_cavity))
    printf("insert tri conforming state %d\n",
           (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}